

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O2

Mat operator*(Mat *left,Mat *right)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  double *pdVar4;
  ulong uVar5;
  long in_RDX;
  double *pdVar6;
  double *pdVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  double dVar15;
  Mat MVar16;
  
  Mat::Mat(left,right->n_rows_,*(int *)(in_RDX + 4));
  uVar1 = *(uint *)(in_RDX + 4);
  pdVar4 = left->v_;
  iVar2 = left->n_cols_;
  uVar10 = 0;
  uVar11 = 0;
  if (0 < (int)uVar1) {
    uVar11 = (ulong)uVar1;
  }
  uVar5 = (ulong)(uint)right->n_rows_;
  if (right->n_rows_ < 1) {
    uVar5 = uVar10;
  }
  pdVar7 = (double *)(long)iVar2;
  for (uVar12 = 0; uVar12 != uVar5; uVar12 = uVar12 + 1) {
    uVar3 = right->n_cols_;
    pdVar6 = (double *)(uVar12 * (long)iVar2);
    uVar13 = 0;
    if (0 < (int)uVar3) {
      uVar13 = (ulong)uVar3;
    }
    lVar14 = 0;
    pdVar7 = pdVar6;
    for (uVar8 = 0; uVar8 != uVar11; uVar8 = uVar8 + 1) {
      pdVar7 = (double *)(*(long *)(in_RDX + 8) + lVar14);
      dVar15 = 0.0;
      for (uVar9 = 0; uVar13 != uVar9; uVar9 = uVar9 + 1) {
        dVar15 = dVar15 + *(double *)((long)right->v_ + uVar9 * 8 + (long)(int)uVar3 * uVar10) *
                          *pdVar7;
        pdVar7 = pdVar7 + (int)uVar1;
      }
      pdVar4[(long)pdVar6 + uVar8] = dVar15;
      lVar14 = lVar14 + 8;
    }
    uVar10 = uVar10 + 8;
  }
  MVar16.v_ = pdVar7;
  MVar16._0_8_ = left;
  return MVar16;
}

Assistant:

Mat operator * (const Mat& left, const Mat& right)
{
	Mat Aux(left.n_rows_, right.n_cols_);
	double Sum;
	for (int i=0; i<left.n_rows_; i++) 
		for (int j=0; j<right.n_cols_; j++)
		{
			Sum = 0.0;
			for (int k=0; k<left.n_cols_; k++) 
			Sum += left.v_[i*left.n_cols_+k] * right.v_[k*right.n_cols_+j];
			Aux.v_[i*Aux.n_cols_+j] = Sum;
		}
	return Aux;
}